

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::declareArray
          (string *__return_storage_ptr__,IOBlock *this,string *sizeExpr)

{
  pointer pMVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ostringstream buf;
  DeclareVariable local_1e8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->m_blockName)._M_dataplus._M_p,
                      (this->m_blockName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if (0 < (int)((ulong)((long)(this->m_members).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_members).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t",1);
      pMVar1 = (this->m_members).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
      glu::decl::DeclareVariable::DeclareVariable
                (&local_1e8,(VarType *)((long)&(pMVar1->type).m_type + lVar4),
                 (string *)((long)&(pMVar1->name)._M_dataplus._M_p + lVar4),0);
      poVar2 = glu::decl::operator<<((ostream *)local_1a8,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_1e8.varType);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < (int)((ulong)((long)(this->m_members).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_members).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->m_interfaceName)._M_dataplus._M_p,
                      (this->m_interfaceName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(sizeExpr->_M_dataplus)._M_p,sizeExpr->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::declareArray (const string& sizeExpr) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < (int)m_members.size(); i++)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << "[" << sizeExpr << "];\n";
	return buf.str();
}